

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libtlp.c
# Opt level: O1

ssize_t nettlp_pcie_cfg_write(nettlp_pcie_cfg *ntpc,uint16_t addr,void *buf,size_t count)

{
  byte bVar1;
  int iVar2;
  ssize_t sVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  undefined6 in_register_00000032;
  ushort uVar9;
  uint uVar10;
  uint uVar11;
  ssize_t sVar12;
  short sVar13;
  bool bVar14;
  bool bVar15;
  uint32_t data;
  uint local_78;
  byte local_72;
  undefined1 local_71;
  uint local_70;
  uint local_6c;
  uint local_68;
  int local_64;
  int local_60;
  int local_5c;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  nettlp_pcie_cfg *local_40;
  void *local_38;
  
  uVar7 = (uint)CONCAT62(in_register_00000032,addr);
  uVar10 = (int)count + uVar7;
  uVar11 = uVar10 & 3;
  local_50 = CONCAT62(in_register_00000032,addr) >> 2;
  uVar9 = (short)(uVar10 >> 2) - (ushort)(uVar11 == 0);
  uVar10 = CONCAT22((ushort)(uVar10 >> 0x12),uVar9);
  local_58 = (ulong)uVar10;
  sVar12 = 0;
  if ((ushort)local_50 <= uVar9) {
    local_5c = 4 - uVar11;
    uVar7 = uVar7 & 3;
    local_48 = (ulong)uVar7;
    local_60 = 4 - uVar7;
    local_50 = local_50 & 0xffff;
    local_64 = (int)local_50 - uVar10;
    local_68 = (uint)((byte)(0xf << (sbyte)uVar7) & 0xe);
    local_6c = 0xfU >> ((byte)local_5c & 0x1f) & 0xff;
    iVar2 = 0;
    iVar5 = 0;
    local_40 = ntpc;
    do {
      bVar14 = local_48 != 0;
      sVar13 = (short)iVar2;
      bVar15 = sVar13 == 0;
      uVar10 = 0xf;
      if (bVar14 && bVar15) {
        uVar10 = local_68;
      }
      uVar4 = 0;
      if (bVar14 && bVar15) {
        uVar4 = local_48;
      }
      iVar8 = 4;
      if (bVar14 && bVar15) {
        iVar8 = local_60;
      }
      iVar6 = local_5c;
      bVar1 = (byte)local_6c;
      if ((short)((short)local_64 + sVar13) != 0 || uVar11 == 0) {
        iVar6 = 0;
        bVar1 = 0x2f;
      }
      iVar8 = iVar8 - iVar6;
      iVar6 = (int)local_50 + iVar2;
      local_78 = 0;
      local_38 = buf;
      memcpy((void *)((long)&local_78 + uVar4),buf,(long)iVar8);
      local_72 = (byte)((uint)iVar6 >> 8) & 3 | (bVar1 & (byte)uVar10) << 2 | 0x40;
      local_71 = (undefined1)iVar6;
      local_70 = local_78 >> 0x18 | (local_78 & 0xff0000) >> 8 | (local_78 & 0xff00) << 8 |
                 local_78 << 0x18;
      sVar3 = write(local_40->sockfd,&local_72,6);
      iVar6 = (int)sVar3;
      if ((int)sVar3 < 0) break;
      buf = (void *)((long)local_38 + (long)iVar8);
      iVar5 = iVar5 + iVar8;
      iVar2 = iVar2 + 1;
      iVar6 = iVar5;
    } while ((ushort)((short)local_50 + sVar13 + 1U) <= (ushort)local_58);
    sVar12 = (ssize_t)iVar6;
  }
  return sVar12;
}

Assistant:

ssize_t nettlp_pcie_cfg_write(struct nettlp_pcie_cfg *ntpc, uint16_t addr,
			      void *buf, size_t count)
{
	int ret;
	uint16_t dwaddr;
	uint8_t mask;
	uint32_t data;
	uint8_t *ptr;

	int len, written = 0;
	uint16_t start_dwaddr, end_dwaddr;
	int fstpad;	/* unnecessary bytes in first DWORD */
	int lstpad;	/* unnecessary bytes in last DWORD */

	fstpad = addr & 0x0003;
	lstpad = 4 - ((addr + count) & 0x0003);

	start_dwaddr = addr >> 2;
	end_dwaddr = (addr + count) >> 2;
	if (lstpad == 4) {
		lstpad = 0;
		end_dwaddr--;
	}

	for (dwaddr = start_dwaddr; dwaddr <= end_dwaddr; dwaddr++) {
		len = 4;
		mask = 0xF;
		data = 0;
		ptr = (uint8_t *)&data;
		if (dwaddr == start_dwaddr && fstpad) {
			mask &= ((0x0F << fstpad) & 0x0F);
			len -= fstpad;
			ptr += fstpad;
		}
		if (dwaddr == end_dwaddr && lstpad) {
			mask &= ((0x0F >> lstpad) & 0x0F);
			len -= lstpad;
		}

		memcpy(ptr, buf, len);

		ret = pcie_cfg_write_dw(ntpc, dwaddr, mask, data);
		if (ret < 0)
			return ret;

		buf += len;
		written += len;
	}

	return written;
}